

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void EccPoint_double_jacobian(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z1)

{
  ulong uVar1;
  uECC_word_t uVar2;
  uECC_word_t uVar3;
  uECC_word_t uVar4;
  uECC_word_t *puVar5;
  ulong uVar6;
  uECC_word_t *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uECC_word_t *end;
  bool bVar11;
  uECC_word_t local_b8;
  uECC_word_t product [8];
  uECC_word_t t4 [4];
  uECC_word_t t5 [4];
  
  lVar8 = 0;
  do {
    puVar7 = Z1 + lVar8;
    if (*puVar7 != 0) break;
    bVar11 = lVar8 != 3;
    lVar8 = lVar8 + 1;
  } while (bVar11);
  if (*puVar7 != 0) {
    puVar7 = product + 7;
    vli_modSquare_fast(puVar7,Y1);
    vli_mult(&local_b8,X1,puVar7);
    vli_mmod_fast(t4 + 3,&local_b8);
    vli_modSquare_fast(puVar7,puVar7);
    vli_mult(&local_b8,Y1,Z1);
    vli_mmod_fast(Y1,&local_b8);
    vli_modSquare_fast(Z1,Z1);
    vli_modAdd(X1,X1,Z1,curve_p);
    puVar7 = curve_p;
    vli_modAdd(Z1,Z1,Z1,curve_p);
    vli_modSub(Z1,X1,Z1,puVar7);
    vli_mult(&local_b8,X1,Z1);
    vli_mmod_fast(X1,&local_b8);
    vli_modAdd(Z1,X1,X1,curve_p);
    vli_modAdd(X1,X1,Z1,curve_p);
    if ((*X1 & 1) == 0) {
      puVar5 = X1 + 4;
      puVar7 = (uECC_word_t *)0x0;
      do {
        uVar9 = puVar5[-1];
        puVar5[-1] = uVar9 >> 1 | (ulong)puVar7;
        puVar5 = puVar5 + -1;
        puVar7 = (uECC_word_t *)(uVar9 << 0x3f);
      } while (X1 < puVar5);
    }
    else {
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar1 = *(ulong *)((long)X1 + lVar8);
        uVar10 = uVar1 + uVar9 + *(long *)((long)curve_p + lVar8);
        uVar6 = (ulong)(uVar10 < uVar1);
        if (uVar10 == uVar1) {
          uVar6 = uVar9;
        }
        *(ulong *)((long)X1 + lVar8) = uVar10;
        lVar8 = lVar8 + 8;
        uVar9 = uVar6;
      } while (lVar8 != 0x20);
      puVar7 = X1 + 4;
      uVar9 = 0;
      do {
        uVar1 = puVar7[-1];
        puVar7[-1] = uVar1 >> 1 | uVar9;
        puVar7 = puVar7 + -1;
        uVar9 = uVar1 << 0x3f;
      } while (X1 < puVar7);
      X1[3] = X1[3] | uVar6 << 0x3f;
    }
    vli_modSquare_fast(Z1,X1);
    puVar5 = t4 + 3;
    vli_modSub(Z1,Z1,puVar5,puVar7);
    vli_modSub(Z1,Z1,puVar5,puVar7);
    vli_modSub(puVar5,puVar5,Z1,puVar7);
    vli_mult(&local_b8,X1,puVar5);
    vli_mmod_fast(X1,&local_b8);
    vli_modSub(product + 7,X1,product + 7,puVar7);
    uVar2 = *Z1;
    uVar3 = Z1[1];
    uVar4 = Z1[3];
    X1[2] = Z1[2];
    X1[3] = uVar4;
    *X1 = uVar2;
    X1[1] = uVar3;
    uVar2 = *Y1;
    uVar3 = Y1[1];
    uVar4 = Y1[3];
    Z1[2] = Y1[2];
    Z1[3] = uVar4;
    *Z1 = uVar2;
    Z1[1] = uVar3;
    Y1[2] = t4[1];
    Y1[3] = t4[2];
    *Y1 = product[7];
    Y1[1] = t4[0];
  }
  return;
}

Assistant:

static void EccPoint_double_jacobian(uECC_word_t * RESTRICT X1,
                                     uECC_word_t * RESTRICT Y1,
                                     uECC_word_t * RESTRICT Z1) {
    /* t1 = X, t2 = Y, t3 = Z */
    uECC_word_t t4[uECC_WORDS];
    uECC_word_t t5[uECC_WORDS];

    if (vli_isZero(Z1)) {
        return;
    }

    vli_modSquare_fast(t4, Y1);   /* t4 = y1^2 */
    vli_modMult_fast(t5, X1, t4); /* t5 = x1*y1^2 = A */
    vli_modSquare_fast(t4, t4);   /* t4 = y1^4 */
    vli_modMult_fast(Y1, Y1, Z1); /* t2 = y1*z1 = z3 */
    vli_modSquare_fast(Z1, Z1);   /* t3 = z1^2 */

    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = x1 + z1^2 */
    vli_modAdd(Z1, Z1, Z1, curve_p); /* t3 = 2*z1^2 */
    vli_modSub_fast(Z1, X1, Z1);     /* t3 = x1 - z1^2 */
    vli_modMult_fast(X1, X1, Z1);    /* t1 = x1^2 - z1^4 */

    vli_modAdd(Z1, X1, X1, curve_p); /* t3 = 2*(x1^2 - z1^4) */
    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = 3*(x1^2 - z1^4) */
    if (vli_testBit(X1, 0)) {
        uECC_word_t l_carry = vli_add(X1, X1, curve_p);
        vli_rshift1(X1);
        X1[uECC_WORDS - 1] |= l_carry << (uECC_WORD_BITS - 1);
    } else {
        vli_rshift1(X1);
    }
    /* t1 = 3/2*(x1^2 - z1^4) = B */

    vli_modSquare_fast(Z1, X1);   /* t3 = B^2 */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - A */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - 2A = x3 */
    vli_modSub_fast(t5, t5, Z1);  /* t5 = A - x3 */
    vli_modMult_fast(X1, X1, t5); /* t1 = B * (A - x3) */
    vli_modSub_fast(t4, X1, t4);  /* t4 = B * (A - x3) - y1^4 = y3 */

    vli_set(X1, Z1);
    vli_set(Z1, Y1);
    vli_set(Y1, t4);
}